

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoMemoryCopy(Thread *this,Instr instr,Ptr *out_trap)

{
  Store *pSVar1;
  u64 dst_offset;
  bool bVar2;
  RefVec *pRVar3;
  const_reference pvVar4;
  Memory *dst_00;
  Memory *src_00;
  allocator<char> local_b9;
  string local_b8;
  Ptr local_98;
  Enum local_7c;
  u64 local_78;
  u64 dst;
  u64 src;
  u64 size;
  undefined1 local_58 [8];
  Ptr mem_src;
  undefined1 local_38 [8];
  Ptr mem_dst;
  Ptr *out_trap_local;
  Thread *this_local;
  
  pSVar1 = this->store_;
  mem_dst.root_index_ = (Index)out_trap;
  pRVar3 = Instance::memories(this->inst_);
  pvVar4 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (pRVar3,(ulong)instr.field_2.imm_u32);
  mem_src.root_index_ = pvVar4->index;
  RefPtr<wabt::interp::Memory>::RefPtr
            ((RefPtr<wabt::interp::Memory> *)local_38,pSVar1,(Ref)mem_src.root_index_);
  pSVar1 = this->store_;
  pRVar3 = Instance::memories(this->inst_);
  pvVar4 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (pRVar3,(ulong)instr.field_2.imm_u32x2.snd);
  size = pvVar4->index;
  RefPtr<wabt::interp::Memory>::RefPtr((RefPtr<wabt::interp::Memory> *)local_58,pSVar1,(Ref)size);
  src = PopPtr(this,(Ptr *)local_58);
  dst = PopPtr(this,(Ptr *)local_58);
  local_78 = PopPtr(this,(Ptr *)local_38);
  dst_00 = RefPtr<wabt::interp::Memory>::operator*((RefPtr<wabt::interp::Memory> *)local_38);
  dst_offset = local_78;
  src_00 = RefPtr<wabt::interp::Memory>::operator*((RefPtr<wabt::interp::Memory> *)local_58);
  local_7c = (Enum)Memory::Copy(dst_00,dst_offset,src_00,dst,src);
  bVar2 = Failed((Result)local_7c);
  if (bVar2) {
    pSVar1 = this->store_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"out of bounds memory access: memory.copy out of bound",&local_b9
              );
    Trap::New(&local_98,pSVar1,&local_b8,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=
              ((RefPtr<wabt::interp::Trap> *)mem_dst.root_index_,&local_98);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
  }
  else {
    this_local._4_4_ = Ok;
  }
  RefPtr<wabt::interp::Memory>::~RefPtr((RefPtr<wabt::interp::Memory> *)local_58);
  RefPtr<wabt::interp::Memory>::~RefPtr((RefPtr<wabt::interp::Memory> *)local_38);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoMemoryCopy(Instr instr, Trap::Ptr* out_trap) {
  Memory::Ptr mem_dst{store_, inst_->memories()[instr.imm_u32x2.fst]};
  Memory::Ptr mem_src{store_, inst_->memories()[instr.imm_u32x2.snd]};
  auto size = PopPtr(mem_src);
  auto src = PopPtr(mem_src);
  auto dst = PopPtr(mem_dst);
  // TODO: change to "out of bounds"
  TRAP_IF(Failed(Memory::Copy(*mem_dst, dst, *mem_src, src, size)),
          "out of bounds memory access: memory.copy out of bound");
  return RunResult::Ok;
}